

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

size_t __thiscall Potassco::StringBuilder::size(StringBuilder *this)

{
  byte bVar1;
  
  bVar1 = (this->field_0).sbo_[0x3f] & 0xc0;
  if (bVar1 == 0x40) {
    return ((this->field_0).str_)->_M_string_length;
  }
  if (bVar1 == 0x80) {
    return (this->field_0).buf_.used;
  }
  return 0x3f - (ulong)(byte)(this->field_0).sbo_[0x3f];
}

Assistant:

std::size_t StringBuilder::size() const {
	return buffer().used;
}